

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

void xmlRegisterCharEncodingHandler(xmlCharEncodingHandlerPtr handler)

{
  long lVar1;
  
  if (handler != (xmlCharEncodingHandlerPtr)0x0) {
    if (globalHandlers == (xmlCharEncodingHandlerPtr *)0x0) {
      globalHandlers = (xmlCharEncodingHandlerPtr *)(*xmlMalloc)(400);
      if (0x31 < nbCharEncodingHandler || globalHandlers == (xmlCharEncodingHandlerPtr *)0x0)
      goto LAB_0012c7da;
    }
    else if (0x31 < nbCharEncodingHandler) {
LAB_0012c7da:
      if (handler->name != (char *)0x0) {
        (*xmlFree)(handler->name);
      }
      (*xmlFree)(handler);
      return;
    }
    lVar1 = (long)nbCharEncodingHandler;
    nbCharEncodingHandler = nbCharEncodingHandler + 1;
    globalHandlers[lVar1] = handler;
  }
  return;
}

Assistant:

void
xmlRegisterCharEncodingHandler(xmlCharEncodingHandlerPtr handler) {
    if (handler == NULL)
        return;
    if (globalHandlers == NULL) {
        globalHandlers = xmlMalloc(
                MAX_ENCODING_HANDLERS * sizeof(globalHandlers[0]));
        if (globalHandlers == NULL)
            goto free_handler;
    }

    if (nbCharEncodingHandler >= MAX_ENCODING_HANDLERS)
        goto free_handler;
    globalHandlers[nbCharEncodingHandler++] = handler;
    return;

free_handler:
    if (handler != NULL) {
        if (handler->name != NULL) {
            xmlFree(handler->name);
        }
        xmlFree(handler);
    }
}